

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.h
# Opt level: O1

void __thiscall
embree::VerifyApplication::IntersectTest::IntersectTest
          (IntersectTest *this,string *name,int sse2,IntersectMode imode,IntersectVariant ivariant,
          TestType ty)

{
  pointer pcVar1;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Test).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Test).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Test_0026adf8;
  (this->super_Test).name._M_dataplus._M_p = (pointer)&(this->super_Test).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Test).name,local_50,local_50 + local_48);
  (this->super_Test).sse2 = sse2;
  (this->super_Test).ty = ty;
  (this->super_Test).enabled = true;
  (this->super_Test).ignoreFailure = false;
  (this->super_Test).sampler.s = 0x232317e1;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  (this->super_Test).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Test_0026bce0;
  this->imode = imode;
  this->ivariant = ivariant;
  return;
}

Assistant:

IntersectTest (std::string name, int isa, IntersectMode imode, IntersectVariant ivariant, TestType ty = TEST_SHOULD_PASS)
        : Test(name,isa,ty), imode(imode), ivariant(ivariant) {}